

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

FString __thiscall FOptionMenuTextField::Represent(FOptionMenuTextField *this)

{
  char *copyStr;
  FOptionMenuFieldBase *in_RSI;
  
  if (*(char *)&in_RSI[1].super_FOptionMenuItem.super_FListMenuItem._vptr_FListMenuItem == '\x01') {
    copyStr = (char *)((long)&in_RSI[1].super_FOptionMenuItem.super_FListMenuItem.
                              _vptr_FListMenuItem + 1);
  }
  else {
    copyStr = FOptionMenuFieldBase::GetCVarString(in_RSI);
  }
  FString::FString((FString *)this,copyStr);
  if (*(char *)&in_RSI[1].super_FOptionMenuItem.super_FListMenuItem._vptr_FListMenuItem == '\x01') {
    FString::operator+=((FString *)this,
                        (((undefined1)gameinfo.gametype & GAME_DoomStrifeChex) != GAME_Any) * '\x04'
                        + '[');
  }
  return (FString)(char *)this;
}

Assistant:

FString Represent()
	{
		FString text = mEntering ? mEditName : GetCVarString();

		if ( mEntering )
			text += ( gameinfo.gametype & GAME_DoomStrifeChex ) ? '_' : '[';

		return text;
	}